

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_tcp_ref4(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  uv_loop_t *unaff_RBX;
  uv_connect_t *puVar3;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t h;
  uv_buf_t uStack_528;
  sockaddr_in sStack_518;
  uv_udp_t uStack_508;
  uv_udp_send_t uStack_450;
  uv_loop_t *puStack_308;
  long lStack_2f8;
  long lStack_2f0;
  sockaddr_in sStack_2e8;
  uv_udp_t uStack_2d8;
  uv_loop_t *puStack_220;
  long lStack_210;
  long lStack_208;
  uv_udp_t uStack_200;
  uv_connect_t *puStack_148;
  undefined8 uStack_138;
  long lStack_130;
  uv_buf_t uStack_128;
  uv_loop_t *puStack_118;
  undefined1 local_100 [32];
  void *local_e0;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_100 + 0x10));
  local_e0 = (void *)(long)iVar1;
  local_100._0_8_ = (uv_loop_t *)0x0;
  if (local_e0 == (void *)0x0) {
    puVar2 = uv_default_loop();
    unaff_RBX = (uv_loop_t *)&stack0xffffffffffffff20;
    uv_tcp_init(puVar2,(uv_tcp_t *)unaff_RBX);
    uv_tcp_connect(&connect_req,(uv_tcp_t *)unaff_RBX,(sockaddr *)(local_100 + 0x10),
                   connect_and_write);
    uv_unref((uv_handle_t *)unaff_RBX);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_100._0_8_ = (uv_loop_t *)0x1;
    local_100._8_8_ = SEXT48(connect_cb_called);
    if ((uv_loop_t *)local_100._8_8_ != (uv_loop_t *)0x1) goto LAB_001b5e66;
    local_100._0_8_ = (uv_loop_t *)0x1;
    local_100._8_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)local_100._8_8_ != (uv_loop_t *)0x1) goto LAB_001b5e75;
    local_100._0_8_ = (uv_loop_t *)0x1;
    local_100._8_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)local_100._8_8_ != (uv_loop_t *)0x1) goto LAB_001b5e84;
    do_close(&stack0xffffffffffffff20);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_100._0_8_ = (uv_loop_t *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    local_100._8_8_ = SEXT48(iVar1);
    if (local_100._0_8_ == local_100._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref4_cold_1();
LAB_001b5e66:
    run_test_tcp_ref4_cold_2();
LAB_001b5e75:
    run_test_tcp_ref4_cold_3();
LAB_001b5e84:
    run_test_tcp_ref4_cold_4();
  }
  puVar3 = (uv_connect_t *)local_100;
  iVar1 = (int)local_100 + 8;
  run_test_tcp_ref4_cold_5();
  puStack_148 = (uv_connect_t *)0x1b5ebe;
  puStack_118 = unaff_RBX;
  uStack_128 = uv_buf_init(buffer,0x7fff);
  if (puVar3 == &connect_req) {
    lStack_130 = (long)iVar1;
    uStack_138 = 0;
    if (lStack_130 == 0) {
      puStack_148 = (uv_connect_t *)0x1b5f15;
      iVar1 = uv_write(&write_req,connect_req.handle,&uStack_128,1,write_cb);
      connect_cb_called = connect_cb_called + 1;
      return iVar1;
    }
  }
  else {
    puStack_148 = (uv_connect_t *)0x1b5f2a;
    connect_and_write_cold_1();
  }
  puStack_148 = (uv_connect_t *)run_test_udp_ref;
  connect_and_write_cold_2();
  puStack_220 = (uv_loop_t *)0x1b5f46;
  puStack_148 = puVar3;
  puVar2 = uv_default_loop();
  puStack_220 = (uv_loop_t *)0x1b5f56;
  uv_udp_init(puVar2,&uStack_200);
  puStack_220 = (uv_loop_t *)0x1b5f5e;
  uv_unref((uv_handle_t *)&uStack_200);
  puStack_220 = (uv_loop_t *)0x1b5f63;
  puVar2 = uv_default_loop();
  puStack_220 = (uv_loop_t *)0x1b5f6d;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_220 = (uv_loop_t *)0x1b5f75;
  do_close(&uStack_200);
  puStack_220 = (uv_loop_t *)0x1b5f7a;
  loop = uv_default_loop();
  puStack_220 = (uv_loop_t *)0x1b5f8e;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  puStack_220 = (uv_loop_t *)0x1b5f98;
  uv_run(loop,UV_RUN_DEFAULT);
  lStack_208 = 0;
  puStack_220 = (uv_loop_t *)0x1b5fa6;
  puVar2 = uv_default_loop();
  puStack_220 = (uv_loop_t *)0x1b5fae;
  iVar1 = uv_loop_close(puVar2);
  lStack_210 = (long)iVar1;
  if (lStack_208 == lStack_210) {
    puStack_220 = (uv_loop_t *)0x1b5fc6;
    uv_library_shutdown();
    return 0;
  }
  puStack_220 = (uv_loop_t *)run_test_udp_ref2;
  run_test_udp_ref_cold_1();
  puStack_308 = (uv_loop_t *)0x1b5ffe;
  puStack_220 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2e8);
  uStack_2d8.data = (void *)(long)iVar1;
  lStack_2f8 = 0;
  if (uStack_2d8.data == (void *)0x0) {
    puStack_308 = (uv_loop_t *)0x1b6023;
    puVar2 = uv_default_loop();
    puStack_308 = (uv_loop_t *)0x1b6033;
    uv_udp_init(puVar2,&uStack_2d8);
    puStack_308 = (uv_loop_t *)0x1b6042;
    uv_udp_bind(&uStack_2d8,(sockaddr *)&sStack_2e8,0);
    puStack_308 = (uv_loop_t *)0x1b6054;
    uv_udp_recv_start(&uStack_2d8,fail_cb,fail_cb);
    puStack_308 = (uv_loop_t *)0x1b605c;
    uv_unref((uv_handle_t *)&uStack_2d8);
    puStack_308 = (uv_loop_t *)0x1b6061;
    puVar2 = uv_default_loop();
    puStack_308 = (uv_loop_t *)0x1b606b;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_308 = (uv_loop_t *)0x1b6073;
    do_close(&uStack_2d8);
    puStack_308 = (uv_loop_t *)0x1b6078;
    loop = uv_default_loop();
    puStack_308 = (uv_loop_t *)0x1b608c;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_308 = (uv_loop_t *)0x1b6096;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_2f8 = 0;
    puStack_308 = (uv_loop_t *)0x1b60a4;
    puVar2 = uv_default_loop();
    puStack_308 = (uv_loop_t *)0x1b60ac;
    iVar1 = uv_loop_close(puVar2);
    lStack_2f0 = (long)iVar1;
    if (lStack_2f8 == lStack_2f0) {
      puStack_308 = (uv_loop_t *)0x1b60c4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_308 = (uv_loop_t *)0x1b60de;
    run_test_udp_ref2_cold_1();
  }
  puStack_308 = (uv_loop_t *)run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  puStack_308 = loop;
  uStack_528 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_518);
  uStack_450.data = (void *)(long)iVar1;
  uStack_508.data = (void *)0x0;
  if (uStack_450.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&uStack_508);
    uv_udp_send(&uStack_450,&uStack_508,&uStack_528,1,(sockaddr *)&sStack_518,req_cb);
    uv_unref((uv_handle_t *)&uStack_508);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (req_cb_called == 1) {
      do_close(&uStack_508);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b6240;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b6240:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref4) {
  struct sockaddr_in addr;
  uv_tcp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_tcp_init(uv_default_loop(), &h);
  uv_tcp_connect(&connect_req,
                 &h,
                 (const struct sockaddr*) &addr,
                 connect_and_write);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}